

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_ESI != 0) {
    if (in_ESI < 0x10000) {
      uVar1 = in_ESI & 0xffff;
    }
    else {
      uVar1 = 0xfffd;
    }
    ImVector<unsigned_short>::push_back
              ((ImVector<unsigned_short> *)(in_RDI + 0x1548),
               (unsigned_short *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    if (c != 0)
        InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
}